

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O0

bool digest_sign_update(EVP_MD_CTX *ctx,BIO *data)

{
  int iVar1;
  undefined1 local_1028 [4];
  int n;
  uint8_t buf [4096];
  BIO *data_local;
  EVP_MD_CTX *ctx_local;
  
  do {
    iVar1 = BIO_read((BIO *)data,local_1028,0x1000);
    if (iVar1 == 0) {
      return true;
    }
  } while ((-1 < iVar1) && (iVar1 = EVP_DigestSignUpdate(ctx,local_1028,(long)iVar1), iVar1 != 0));
  return false;
}

Assistant:

static bool digest_sign_update(EVP_MD_CTX *ctx, BIO *data) {
  for (;;) {
    uint8_t buf[4096];
    const int n = BIO_read(data, buf, sizeof(buf));
    if (n == 0) {
      return true;
    } else if (n < 0 || !EVP_DigestSignUpdate(ctx, buf, n)) {
      return false;
    }
  }
}